

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::CodeGeneratorResponse::ByteSizeLong(CodeGeneratorResponse *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *this_00;
  reference value;
  uint32_t *puVar5;
  string *value_00;
  size_t sVar6;
  uint64_t value_01;
  CodeGeneratorResponse_File *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  CodeGeneratorResponse *this_;
  CodeGeneratorResponse *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_file_size(this);
  sStack_58 = (size_t)iVar3;
  this_00 = _internal_file(this);
  __end3 = RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::begin(this_00);
  msg = (CodeGeneratorResponse_File *)
        RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::end(this_00);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value = internal::
            RepeatedPtrIterator<const_google::protobuf::compiler::CodeGeneratorResponse_File>::
            operator*(&__end3);
    sVar6 = internal::WireFormatLite::
            MessageSize<google::protobuf::compiler::CodeGeneratorResponse_File>(value);
    sStack_58 = sVar6 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::compiler::CodeGeneratorResponse_File>::
    operator++(&__end3);
  }
  puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      value_00 = _internal_error_abi_cxx11_(this);
      sVar6 = internal::WireFormatLite::StringSize(value_00);
      sStack_58 = sVar6 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      value_01 = _internal_supported_features(this);
      sVar6 = internal::WireFormatLite::UInt64SizePlusOne(value_01);
      sStack_58 = sVar6 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      iVar4 = _internal_minimum_edition(this);
      sVar6 = internal::WireFormatLite::Int32SizePlusOne(iVar4);
      sStack_58 = sVar6 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      iVar4 = _internal_maximum_edition(this);
      sVar6 = internal::WireFormatLite::Int32SizePlusOne(iVar4);
      sStack_58 = sVar6 + sStack_58;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t CodeGeneratorResponse::ByteSizeLong() const {
  const CodeGeneratorResponse& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorResponse)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
    {
      total_size += 1UL * this_._internal_file_size();
      for (const auto& msg : this_._internal_file()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    // optional string error = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_error());
    }
    // optional uint64 supported_features = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_supported_features());
    }
    // optional int32 minimum_edition = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_minimum_edition());
    }
    // optional int32 maximum_edition = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_maximum_edition());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}